

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayout::itemAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *pQVar2;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  QLayoutItem *ret;
  QDockAreaLayoutInfo *dock;
  int i;
  int local_20;
  int *x_00;
  QDockAreaLayoutInfo *in_stack_fffffffffffffff8;
  
  local_20 = 0;
  x_00 = in_RDI;
  while( true ) {
    if (3 < local_20) {
      if ((*(long *)(in_RDI + 8) == 0) || (iVar1 = *in_RSI, *in_RSI = iVar1 + 1, iVar1 != in_EDX)) {
        pQVar2 = (QLayoutItem *)0x0;
      }
      else {
        pQVar2 = *(QLayoutItem **)(in_RDI + 8);
      }
      return pQVar2;
    }
    pQVar2 = QDockAreaLayoutInfo::itemAt
                       (in_stack_fffffffffffffff8,x_00,(int)((ulong)in_RSI >> 0x20));
    if (pQVar2 != (QLayoutItem *)0x0) break;
    local_20 = local_20 + 1;
  }
  return pQVar2;
}

Assistant:

QLayoutItem *QDockAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.itemAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index)
        return centralWidgetItem;

    return nullptr;
}